

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

void __thiscall CMeshClosestPointMapper::SeamTool::Process(SeamTool *this)

{
  ON_MeshTopologyEdge *tc;
  ON_MeshTopologyEdge *te;
  undefined1 auVar1 [16];
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  Data *pDVar5;
  ON_MeshTopology *pOVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  ON_MeshTopologyFace *this_00;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int ofi;
  ON_SimpleArray<int> seamlessFis;
  ON_SimpleArray<int> seamedFis;
  ON_Line seamLine;
  uint local_10c;
  ON_RTree *local_108;
  ON_SimpleArray<int> local_100;
  ON_SimpleArray<int> local_e8;
  _func_int **local_d0;
  long local_c8;
  ON_Line local_c0;
  ON_BoundingBox local_90;
  ON_BoundingBox local_60;
  
  this->m_bHasSeams = false;
  iVar4 = ON_Mesh::FaceCount(this->m_mesh);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar4;
  uVar10 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
    uVar10 = SUB168(auVar1 * ZEXT816(0x18),0);
  }
  pDVar5 = (Data *)operator_new__(uVar10);
  this->m_faceData = pDVar5;
  iVar4 = ON_Mesh::FaceCount(this->m_mesh);
  if (0 < iVar4) {
    local_108 = &this->m_seamTree;
    uVar10 = 0;
    local_d0 = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
    do {
      pp_Var2 = local_d0;
      local_e8._vptr_ON_SimpleArray = local_d0;
      local_e8.m_a = (int *)0x0;
      local_e8.m_count = 0;
      local_e8.m_capacity = 0;
      ON_SimpleArray<int>::SetCapacity(&local_e8,4);
      local_100._vptr_ON_SimpleArray = pp_Var2;
      local_100.m_a = (int *)0x0;
      local_100.m_count = 0;
      local_100.m_capacity = 0;
      ON_SimpleArray<int>::SetCapacity(&local_100,4);
      pOVar6 = ON_Mesh::Topology(this->m_mesh);
      this_00 = (pOVar6->m_topf).m_a + uVar10;
      bVar3 = ON_MeshTopologyFace::IsTriangle(this_00);
      local_c8 = 4 - (ulong)bVar3;
      lVar11 = 0;
      do {
        pOVar6 = ON_Mesh::Topology(this->m_mesh);
        tc = (pOVar6->m_tope).m_a + this_00->m_topei[lVar11];
        if (tc->m_topf_count == 2) {
          te = (ON_MeshTopologyEdge *)tc->m_topfi;
          local_10c = te->m_topvi[0];
          if (uVar10 == local_10c) {
            local_10c = te->m_topvi[1];
          }
          bVar3 = TcContinuous((CMeshClosestPointMapper *)this->m_mesh,(ON_Mesh *)this->m_tc,
                               (ON_2fPointArray *)tc,te);
          if (bVar3) {
            ON_SimpleArray<int>::Append(&local_100,(int *)&local_10c);
          }
          else {
            ON_SimpleArray<int>::Append(&local_e8,(int *)&local_10c);
            pOVar6 = ON_Mesh::Topology(this->m_mesh);
            ON_MeshTopology::TopEdgeLine(&local_c0,pOVar6,this_00->m_topei[lVar11]);
            ON_Line::BoundingBox(&local_60,&local_c0);
            pdVar7 = ON_3dPoint::operator_cast_to_double_(&local_60.m_min);
            ON_Line::BoundingBox(&local_90,&local_c0);
            pdVar8 = ON_3dPoint::operator_cast_to_double_(&local_90.m_max);
            ON_RTree::Insert(local_108,pdVar7,pdVar8,this_00->m_topei[lVar11]);
            this->m_bHasSeams = true;
LAB_004e57ad:
            ON_Line::~ON_Line(&local_c0);
          }
        }
        else if (2 < tc->m_topf_count) {
          pOVar6 = ON_Mesh::Topology(this->m_mesh);
          ON_MeshTopology::TopEdgeLine(&local_c0,pOVar6,this_00->m_topei[lVar11]);
          ON_Line::BoundingBox(&local_60,&local_c0);
          pdVar7 = ON_3dPoint::operator_cast_to_double_(&local_60.m_min);
          ON_Line::BoundingBox(&local_90,&local_c0);
          pdVar8 = ON_3dPoint::operator_cast_to_double_(&local_90.m_max);
          ON_RTree::Insert(local_108,pdVar7,pdVar8,this_00->m_topei[lVar11]);
          iVar4 = tc->m_topf_count;
          if (0 < iVar4) {
            lVar9 = 0;
            lVar12 = 0;
            do {
              if (uVar10 != *(uint *)((long)tc->m_topfi + lVar9)) {
                ON_SimpleArray<int>::Append(&local_e8,(int *)((long)tc->m_topfi + lVar9));
                this->m_bHasSeams = true;
                iVar4 = tc->m_topf_count;
              }
              lVar12 = lVar12 + 1;
              lVar9 = lVar9 + 4;
            } while (lVar12 < iVar4);
          }
          goto LAB_004e57ad;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != local_c8);
      Data::Set(this->m_faceData + uVar10,&local_100,&local_e8);
      ON_SimpleArray<int>::~ON_SimpleArray(&local_100);
      ON_SimpleArray<int>::~ON_SimpleArray(&local_e8);
      uVar10 = uVar10 + 1;
      iVar4 = ON_Mesh::FaceCount(this->m_mesh);
    } while ((long)uVar10 < (long)iVar4);
  }
  this->m_bProcessed = true;
  return;
}

Assistant:

void Process() const
    {
      m_bHasSeams = false;
      m_faceData = new Data[m_mesh.FaceCount()];
      for (int fi = 0; fi < m_mesh.FaceCount(); fi++)
      {
        ON_SimpleArray<int> seamedFis(4);
        ON_SimpleArray<int> seamlessFis(4);
        const ON_MeshTopologyFace& tf = m_mesh.Topology().m_topf[fi];
        const int fec = tf.IsTriangle() ? 3 : 4;
        for (int i = 0; i < fec; i++)
        {
          const ON_MeshTopologyEdge& te = m_mesh.Topology().m_tope[tf.m_topei[i]];
          if (te.m_topf_count == 2)
          {
            const int ofi = te.m_topfi[0] == fi ? te.m_topfi[1] : te.m_topfi[0];
            if (TcContinuous(m_mesh, m_tc, te))
            {
              seamlessFis.Append(ofi);
            }
            else
            {
              seamedFis.Append(ofi);
              const ON_Line seamLine = m_mesh.Topology().TopEdgeLine(tf.m_topei[i]);
              m_seamTree.Insert(seamLine.BoundingBox().m_min, seamLine.BoundingBox().m_max, tf.m_topei[i]);
              m_bHasSeams = true;
            }
          }
          else if (te.m_topf_count > 2)
          {
            const ON_Line seamLine = m_mesh.Topology().TopEdgeLine(tf.m_topei[i]);
            m_seamTree.Insert(seamLine.BoundingBox().m_min, seamLine.BoundingBox().m_max, tf.m_topei[i]);
            for (int j = 0; j < te.m_topf_count; j++)
            {
              if (te.m_topfi[j] != fi)
              {
                seamedFis.Append(te.m_topfi[j]);
                m_bHasSeams = true;
              }
            }
          }
        }
        m_faceData[fi].Set(seamlessFis, seamedFis);
      }
      m_bProcessed = true;
    }